

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::insert
          (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this,
          unsigned_long insert_key,value_type v)

{
  bool bVar1;
  anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1 local_30;
  art_key_type k;
  unsigned_long insert_key_local;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *this_local;
  value_type v_local;
  
  k.field_0 = (anon_union_8_2_3c23a32d_for_basic_art_key<unsigned_long>_1)insert_key;
  detail::basic_art_key<unsigned_long>::basic_art_key<unsigned_long,_0>
            ((basic_art_key<unsigned_long> *)&local_30.key_bytes,insert_key);
  bVar1 = insert_internal(this,(art_key_type)local_30,v);
  return bVar1;
}

Assistant:

[[nodiscard]] bool insert(Key insert_key, value_type v) {
    // TODO(thompsonbry) There should be a lambda variant of this to
    // handle conflicts and support upsert or delete-upsert
    // semantics. This would call the caller's lambda once the method
    // was positioned on the leaf.  The caller could then update the
    // value or perhaps delete the entry under the key.
    const auto k = art_key_type{insert_key};
    return insert_internal(k, v);
  }